

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_math.cpp
# Opt level: O0

double * ON_BinarySearchDoubleArray(double key,double *base,size_t nel)

{
  size_t sVar1;
  double dVar2;
  double d;
  size_t i;
  size_t nel_local;
  double *base_local;
  double key_local;
  
  if ((nel != 0) && (base != (double *)0x0)) {
    dVar2 = key - *base;
    if (dVar2 < 0.0) {
      return (double *)0x0;
    }
    if ((dVar2 == 0.0) && (!NAN(dVar2))) {
      return base;
    }
    dVar2 = key - base[nel - 1];
    if (0.0 < dVar2) {
      return (double *)0x0;
    }
    sVar1 = nel;
    nel_local = (size_t)base;
    if ((dVar2 == 0.0) && (sVar1 = nel, !NAN(dVar2))) {
      return base + (nel - 1);
    }
    while (i = sVar1, i != 0) {
      sVar1 = i >> 1;
      dVar2 = key - *(double *)(nel_local + sVar1 * 8);
      if (0.0 <= dVar2) {
        if (dVar2 <= 0.0) {
          return (double *)(nel_local + sVar1 * 8);
        }
        nel_local = (sVar1 + 1) * 8 + nel_local;
        sVar1 = i - (sVar1 + 1);
      }
    }
  }
  return (double *)0x0;
}

Assistant:

const double* ON_BinarySearchDoubleArray( double key, const double* base, size_t nel )
{
  if (nel > 0 && base )
  {
    size_t i;
    double d;

    // The end tests are not necessary, but they
    // seem to provide overall speed improvement
    // for the types of searches that call this
    // function.
    d = key-base[0];
    if ( d < 0.0 )
      return 0;
    if ( 0.0 == d )
      return base;

    d = key-base[nel-1];
    if ( d > 0.0 )
      return 0;
    if ( 0.0 == d )
      return (base + (nel-1));

    while ( nel > 0 )
    {
      i = nel/2;
      d = key - base[i];
      if ( d < 0.0 )
      {
        nel = i;
      }
      else if ( d > 0.0 )
      {
        i++;
        base += i;
        nel -= i;
      }
      else
      {
        return base+i;
      }
    }
  }
  return 0;
}